

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::GetTexLockOffset
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  uint32_t uVar1;
  long lVar2;
  uint8_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  int iVar6;
  GMM_PLATFORM_INFO *pGVar7;
  anon_union_8_2_48ff183f_for_anon_struct_16_3_bc420dd9_for_Lock_0 aVar8;
  undefined4 extraout_var_00;
  GMM_PLATFORM_INFO *pPlatform;
  uint32_t SliceRow;
  uint32_t NumberOfMipsInSingleRow;
  uint32_t MipLevel;
  uint32_t MipWidth;
  uint32_t MipHeight;
  uint32_t Slice;
  uint32_t Pitch;
  GMM_GFX_SIZE_T AddressOffset;
  GMM_REQ_OFFSET_INFO *pGStack_28;
  GMM_STATUS Result;
  GMM_REQ_OFFSET_INFO *pReqInfo_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  undefined4 extraout_var;
  
  AddressOffset._4_4_ = GMM_SUCCESS;
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return GMM_ERROR;
  }
  if (pReqInfo == (GMM_REQ_OFFSET_INFO *)0x0) {
    return GMM_ERROR;
  }
  pGStack_28 = pReqInfo;
  pReqInfo_local = (GMM_REQ_OFFSET_INFO *)pTexInfo;
  pTexInfo_local = (GMM_TEXTURE_INFO *)this;
  pGVar7 = GmmGetPlatformInfo(this->pGmmLibContext);
  _Slice = 0;
  MipHeight = pReqInfo_local[2].Render.field_0.Offset;
  uVar1 = pGStack_28->MipLevel;
  MipWidth = pGStack_28->Slice;
  uVar3 = GmmIsPlanar(pReqInfo_local->ArrayIndex);
  if (uVar3 != '\0') {
    aVar8._0_4_ = (*this->_vptr_GmmTextureCalc[0x10])(this,pReqInfo_local,pGStack_28);
    aVar8.Offset64._4_4_ = extraout_var;
    (pGStack_28->Lock).field_0 = aVar8;
    (pGStack_28->Lock).Pitch = MipHeight;
    if ((pGStack_28->Plane == GMM_PLANE_3D_UV0) || (pGStack_28->Plane == GMM_PLANE_3D_UV1)) {
      uVar1 = pReqInfo_local->ArrayIndex;
      if ((uVar1 - 0x14f < 2) || ((uVar1 == 0x15c || (uVar1 == 0x174)))) {
        (pGStack_28->Lock).Pitch = (pGStack_28->Lock).Pitch >> 1;
      }
      else if (uVar1 == 0x175) {
        (pGStack_28->Lock).Pitch = (pGStack_28->Lock).Pitch >> 2;
      }
    }
    return AddressOffset._4_4_;
  }
  iVar6 = *(int *)pReqInfo_local;
  if (1 < iVar6 - 1U) {
    if (iVar6 == 3) {
      if ((int)(pGVar7->Platform).eRenderCoreFamily < 0xc) {
        MipLevel = (pReqInfo_local->Lock).Pitch >> ((byte)uVar1 & 0x1f);
        NumberOfMipsInSingleRow = (pReqInfo_local->Lock).field_0.Offset >> ((byte)uVar1 & 0x1f);
        AlignTexHeightWidth(this,(GMM_TEXTURE_INFO *)pReqInfo_local,&MipLevel,
                            &NumberOfMipsInSingleRow);
        uVar5 = GFX_2_TO_POWER_OF(uVar1);
        lVar2 = *(long *)(&pReqInfo_local[3].MipLevel + (ulong)uVar1 * 2);
        (pGStack_28->Lock).field_2.Mip0SlicePitch = (uint32_t)*(undefined8 *)(pReqInfo_local + 3);
        _Slice = (ulong)(MipWidth / uVar5) * (ulong)MipLevel * (ulong)MipHeight + lVar2;
        if (MipWidth % uVar5 != 0) {
          _Slice = (((ulong)MipWidth % (ulong)uVar5) * (ulong)NumberOfMipsInSingleRow *
                    (ulong)pReqInfo_local->MipLevel >> 3) + _Slice;
        }
      }
      else {
        uVar4 = (*this->_vptr_GmmTextureCalc[0x10])(this,pReqInfo_local,pGStack_28);
        _Slice = (ulong)uVar4;
        (pGStack_28->Lock).field_2.Mip0SlicePitch = (uint32_t)*(undefined8 *)(pReqInfo_local + 3);
      }
      goto LAB_002960e6;
    }
    if (iVar6 != 4) {
      _Slice = 0;
      goto LAB_002960e6;
    }
  }
  iVar6 = (*this->_vptr_GmmTextureCalc[0x10])(this,pReqInfo_local,pGStack_28);
  _Slice = CONCAT44(extraout_var_00,iVar6);
LAB_002960e6:
  (pGStack_28->Lock).field_0.Offset64 = _Slice;
  (pGStack_28->Lock).Pitch = MipHeight;
  return AddressOffset._4_4_;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::GetTexLockOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                                    GMM_REQ_OFFSET_INFO *pReqInfo)
{
    GMM_STATUS     Result = GMM_SUCCESS;
    GMM_GFX_SIZE_T AddressOffset;
    uint32_t       Pitch, Slice;
    uint32_t       MipHeight, MipWidth, MipLevel;
    uint32_t       NumberOfMipsInSingleRow, SliceRow;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pReqInfo, GMM_ERROR);

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    // set default value
    AddressOffset = 0;
    Pitch         = GFX_ULONG_CAST(pTexInfo->Pitch);
    MipLevel      = pReqInfo->MipLevel;
    Slice         = pReqInfo->Slice;

    if(GmmIsPlanar(pTexInfo->Format))
    {
        AddressOffset           = GetMipMapByteAddress(pTexInfo, pReqInfo);
        pReqInfo->Lock.Offset64 = AddressOffset;
        pReqInfo->Lock.Pitch    = Pitch;

        // Adjust returned pitch for non-uniform-pitch U/V queries...
        if((pReqInfo->Plane == GMM_PLANE_U) ||
           (pReqInfo->Plane == GMM_PLANE_V))
        {
            switch(pTexInfo->Format)
            {
                case GMM_FORMAT_I420:
                case GMM_FORMAT_IYUV:
                case GMM_FORMAT_YV12:
                case GMM_FORMAT_NV11:
                    pReqInfo->Lock.Pitch /= 2;
                    break;
                case GMM_FORMAT_YVU9:
                    pReqInfo->Lock.Pitch /= 4;
                    break;
                default:
                    //Cool--Constant pitch across all planes.
                    break;
            }
        }

        return Result;
    }

    switch(pTexInfo->Type)
    {
        case RESOURCE_3D:
        {
            if(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE)
            {
                AddressOffset = GFX_ULONG_CAST(GetMipMapByteAddress(pTexInfo, pReqInfo));

                // Bytes from one slice to the next...
                pReqInfo->Lock.Gen9PlusSlicePitch = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock);
            }
            else
            {
                MipHeight = pTexInfo->BaseHeight >> MipLevel;
                MipWidth  = GFX_ULONG_CAST(pTexInfo->BaseWidth) >> MipLevel;

                AlignTexHeightWidth(pTexInfo, &MipHeight, &MipWidth);

                // See how many mip can fit in one row
                NumberOfMipsInSingleRow = GFX_2_TO_POWER_OF(MipLevel);

                SliceRow = Slice / NumberOfMipsInSingleRow;

                // get the base address + Slice pitch
                AddressOffset = pTexInfo->OffsetInfo.Texture3DOffsetInfo.Offset[MipLevel];

                pReqInfo->Lock.Mip0SlicePitch = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Texture3DOffsetInfo.Mip0SlicePitch);

                // Actual address is offset based on requested slice
                AddressOffset += (GMM_GFX_SIZE_T)SliceRow * MipHeight * Pitch;

                // Get to particular slice
                if(Slice % NumberOfMipsInSingleRow)
                {
                    AddressOffset += (((GMM_GFX_SIZE_T)(Slice % NumberOfMipsInSingleRow) *
                                       MipWidth * pTexInfo->BitsPerPixel) >>
                                      3);
                }
            }
            break;
        }
        case RESOURCE_CUBE:
        case RESOURCE_2D:
        case RESOURCE_1D:
        {
            AddressOffset = GetMipMapByteAddress(pTexInfo, pReqInfo);
            break;
        }
        default:
        { // These resources dont' have multiple levels of detail
            AddressOffset = 0;
            break;
        }
    }

    pReqInfo->Lock.Offset64 = AddressOffset;
    pReqInfo->Lock.Pitch    = Pitch;

    return Result;
}